

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall
glslang::TBuiltIns::addSubpassSampling
          (TBuiltIns *this,TSampler sampler,TString *typeName,int param_3,EProfile param_4)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  
  this_00 = (this->super_TBuiltInParseables).stageBuiltins + 4;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,this->prefixes[(ulong)(uint)sampler & 0xff]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,"vec4 subpassLoad");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,"(");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,(typeName->_M_dataplus)._M_p);
  if (((uint)sampler >> 0x12 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,");\n");
  return;
}

Assistant:

void TBuiltIns::addSubpassSampling(TSampler sampler, const TString& typeName, int /*version*/, EProfile /*profile*/)
{
    stageBuiltins[EShLangFragment].append(prefixes[sampler.type]);
    stageBuiltins[EShLangFragment].append("vec4 subpassLoad");
    stageBuiltins[EShLangFragment].append("(");
    stageBuiltins[EShLangFragment].append(typeName.c_str());
    if (sampler.isMultiSample())
        stageBuiltins[EShLangFragment].append(", int");
    stageBuiltins[EShLangFragment].append(");\n");
}